

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O0

void __thiscall
CCheckQueue<UniqueCheck>::Add
          (CCheckQueue<FakeCheckCheckCompletion> *this,
          vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *vChecks)

{
  long lVar1;
  bool bVar2;
  move_iterator<__gnu_cxx::__normal_iterator<UniqueCheck_*,_std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>_>_>
  __last;
  move_iterator<__gnu_cxx::__normal_iterator<UniqueCheck_*,_std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>_>_>
  this_00;
  size_type sVar3;
  const_iterator in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  Mutex *in_stack_ffffffffffffff58;
  __normal_iterator<UniqueCheck_*,_std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>_>
  in_stack_ffffffffffffff60;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
  *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffff98;
  move_iterator<__gnu_cxx::__normal_iterator<UniqueCheck_*,_std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>_>_>
  __first;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>::empty(in_stack_ffffffffffffff68);
  if (!bVar2) {
    MaybeCheckNotHeld(in_stack_ffffffffffffff58);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RDI,in_stack_ffffffffffffff80,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff78 >> 0x18,0));
    std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>::end
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               in_stack_ffffffffffffff60._M_current);
    __gnu_cxx::
    __normal_iterator<UniqueCheck_const*,std::vector<UniqueCheck,std::allocator<UniqueCheck>>>::
    __normal_iterator<UniqueCheck*>
              ((__normal_iterator<const_UniqueCheck_*,_std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>_>
                *)in_stack_ffffffffffffff68,
               (__normal_iterator<UniqueCheck_*,_std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>_>
                *)in_stack_ffffffffffffff60._M_current);
    __last._M_current._M_current =
         std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>::begin
                   ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                    in_stack_ffffffffffffff60._M_current);
    this_00 = std::
              make_move_iterator<__gnu_cxx::__normal_iterator<UniqueCheck*,std::vector<UniqueCheck,std::allocator<UniqueCheck>>>>
                        (in_stack_ffffffffffffff60);
    __first = this_00;
    std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>::end
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               in_stack_ffffffffffffff60._M_current);
    std::
    make_move_iterator<__gnu_cxx::__normal_iterator<UniqueCheck*,std::vector<UniqueCheck,std::allocator<UniqueCheck>>>>
              (in_stack_ffffffffffffff60);
    std::vector<UniqueCheck,std::allocator<UniqueCheck>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<UniqueCheck*,std::vector<UniqueCheck,std::allocator<UniqueCheck>>>>,void>
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               this_00._M_current._M_current,in_RSI,__first,__last);
    sVar3 = std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>::size
                      ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                        *)in_stack_ffffffffffffff58);
    *(int *)(in_RDI + 0xac) = *(int *)(in_RDI + 0xac) + (int)sVar3;
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff58);
    sVar3 = std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>::size
                      ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                        *)in_stack_ffffffffffffff58);
    if (sVar3 == 1) {
      std::condition_variable::notify_one();
    }
    else {
      std::condition_variable::notify_all();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        if (vChecks.empty()) {
            return;
        }

        {
            LOCK(m_mutex);
            queue.insert(queue.end(), std::make_move_iterator(vChecks.begin()), std::make_move_iterator(vChecks.end()));
            nTodo += vChecks.size();
        }

        if (vChecks.size() == 1) {
            m_worker_cv.notify_one();
        } else {
            m_worker_cv.notify_all();
        }
    }